

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void norm_3d(float32 ***arr,uint32 d1,uint32 d2,uint32 d3)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  for (uVar1 = 0; uVar1 != d1; uVar1 = uVar1 + 1) {
    for (uVar2 = 0; uVar2 != d2; uVar2 = uVar2 + 1) {
      dVar4 = 0.0;
      for (uVar3 = 0; d3 != uVar3; uVar3 = uVar3 + 1) {
        dVar4 = dVar4 + (double)(float)arr[uVar1][uVar2][uVar3];
      }
      for (uVar3 = 0; d3 != uVar3; uVar3 = uVar3 + 1) {
        arr[uVar1][uVar2][uVar3] =
             (float32)(float)((double)(float)arr[uVar1][uVar2][uVar3] * (1.0 / dVar4));
      }
    }
  }
  return;
}

Assistant:

void
norm_3d(float32 ***arr,
	uint32 d1,
	uint32 d2,
	uint32 d3)
{
    uint32 i, j, k;
    float64 s;

    for (i = 0; i < d1; i++) {
	for (j = 0; j < d2; j++) {

	    /* compute sum (i, j) as over all k */
	    for (k = 0, s = 0; k < d3; k++) {
		s += arr[i][j][k];
	    }

	    /* do 1 floating point divide */
	    s = 1.0 / s;

	    /* divide all k by sum over k */
	    for (k = 0; k < d3; k++) {
		arr[i][j][k] *= s;
	    }
	}
    }
}